

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_check_text(nk_context *ctx,char *text,int len,nk_bool active)

{
  nk_widget_layout_states nVar1;
  nk_bool in_ECX;
  long in_RDI;
  nk_bool *unaff_retaddr;
  nk_command_buffer *in_stack_00000008;
  nk_flags *in_stack_00000010;
  nk_widget_layout_states state;
  undefined1 in_stack_0000001c [16];
  nk_rect bounds;
  nk_style *style;
  nk_input *in;
  nk_panel *layout;
  nk_window *win;
  nk_rect *in_stack_ffffffffffffffc8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if ((((in_RDI != 0) && (*(long *)(in_RDI + 0x40d8) != 0)) &&
      (*(long *)(*(long *)(in_RDI + 0x40d8) + 0xa8) != 0)) &&
     (nVar1 = nk_widget(in_stack_ffffffffffffffc8,(nk_context *)(in_RDI + 0x168)),
     nVar1 != NK_WIDGET_INVALID)) {
    nk_do_toggle(in_stack_00000010,in_stack_00000008,(nk_rect)in_stack_0000001c,unaff_retaddr,
                 (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                 (int)((ulong)in_RDI >> 0x20),(nk_toggle_type)in_RDI,(nk_style_toggle *)in,
                 (nk_input *)layout,(nk_user_font *)win);
  }
  return in_ECX;
}

Assistant:

NK_API nk_bool
nk_check_text(struct nk_context *ctx, const char *text, int len, nk_bool active)
{
struct nk_window *win;
struct nk_panel *layout;
const struct nk_input *in;
const struct nk_style *style;

struct nk_rect bounds;
enum nk_widget_layout_states state;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return active;

win = ctx->current;
style = &ctx->style;
layout = win->layout;

state = nk_widget(&bounds, ctx);
if (!state) return active;
in = (state == NK_WIDGET_ROM || layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
nk_do_toggle(&ctx->last_widget_state, &win->buffer, bounds, &active,
text, len, NK_TOGGLE_CHECK, &style->checkbox, in, style->font);
return active;
}